

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

void pnga_update_ghosts_nb(Integer g_a,Integer *nbhandle)

{
  short sVar1;
  short sVar2;
  long lVar3;
  long lVar4;
  logical lVar5;
  size_t sVar6;
  Integer IVar7;
  long lVar8;
  long in_RDI;
  int _d_7;
  int _i_10;
  int _ndim_9;
  int _i_9;
  int _itmp_3;
  int _offset_3;
  int _ndim_8;
  int _i_8;
  int _index_7 [7];
  int _ndim_7;
  int _i_7;
  int _itmp_2;
  int _ndim_6;
  int _i_6;
  int _index_6 [7];
  int _ndim_5;
  int _i_5;
  Integer _dimpos_3;
  Integer _dimstart_3;
  Integer _dim_3;
  Integer _index_5;
  Integer _d_6;
  Integer _nb_3;
  Integer _loc_3;
  Integer _dimpos_2;
  Integer _dimstart_2;
  Integer _dim_2;
  Integer _index_4;
  Integer _d_5;
  Integer _nb_2;
  Integer _loc_2;
  Integer _hi_1 [7];
  Integer _lo_1 [7];
  Integer _offset_2;
  Integer _last_1;
  Integer _factor_1;
  Integer _d_4;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_3;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_2;
  Integer _nb;
  Integer _loc;
  Integer _hi [7];
  Integer _lo [7];
  Integer _offset;
  Integer _last;
  Integer _factor;
  Integer _d_1;
  char err_string [256];
  char *str;
  int _l;
  int _d;
  Integer *_ga_proclist;
  Integer *_ga_map;
  Integer p_handle;
  Integer me;
  char *ptr_rem;
  char *ptr_loc;
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  logical mask0;
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer plo_rem [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer phi_loc [7];
  Integer plo_loc [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer dims [7];
  Integer width [7];
  Integer itmp;
  Integer i;
  Integer ndim;
  Integer size;
  Integer mask [7];
  Integer ntot;
  Integer proc_rem;
  Integer handle;
  Integer np;
  Integer ipx;
  Integer idx;
  int in_stack_fffffffffffff7ac;
  int *count_00;
  int *dst_stride_arr;
  Integer *in_stack_fffffffffffff7c0;
  Integer *dst_ptr;
  int *src_stride_arr;
  int *src_ptr;
  long in_stack_fffffffffffff7e0;
  int iVar9;
  int iVar10;
  int local_80c;
  int local_808;
  int local_804;
  int local_7fc;
  int local_7f8 [7];
  int local_7dc;
  int local_7d8;
  int local_7d4;
  int local_7d0;
  int local_7cc;
  int local_7c8 [10];
  int local_7a0;
  int local_79c;
  long local_798;
  long local_790;
  long local_788;
  long local_780;
  long local_778;
  long local_770;
  long local_768;
  long local_760;
  long local_758;
  long local_750;
  long local_748;
  long local_740;
  long local_738;
  long local_730;
  long local_728 [8];
  long local_6e8 [4];
  Integer in_stack_fffffffffffff938;
  char *in_stack_fffffffffffff940;
  long local_6b0;
  long local_6a0;
  long local_698;
  int local_68c;
  int local_688;
  int local_684;
  int local_67c;
  int local_678 [2];
  Integer in_stack_fffffffffffff990;
  int local_658;
  int local_654;
  int local_64c;
  int local_648 [10];
  int local_620;
  int local_61c;
  long local_618;
  long local_610;
  long local_608;
  long local_600;
  long local_5f8;
  long local_5f0;
  long local_5e8;
  long local_5e0;
  long local_5d8;
  long local_5d0;
  long local_5c8;
  long local_5c0;
  long local_5b8;
  long local_5b0;
  long local_5a8 [8];
  long local_568 [2];
  Integer *in_stack_fffffffffffffaa8;
  Integer *in_stack_fffffffffffffab0;
  Integer in_stack_fffffffffffffab8;
  Integer in_stack_fffffffffffffac0;
  long local_528;
  long local_518;
  long local_510;
  char local_508 [256];
  char *local_408;
  int local_400;
  int local_3fc;
  long *local_3f8;
  void *local_3f0;
  long local_3e8;
  Integer local_3e0;
  int *local_3d8;
  Integer *local_3d0;
  int local_3c8 [8];
  int local_3a8 [8];
  int local_388 [10];
  long local_360;
  long local_358 [8];
  long local_318 [8];
  long alStack_2d8 [8];
  long local_298 [8];
  long local_258 [8];
  long alStack_218 [8];
  C_Integer aCStack_1d8 [8];
  long local_198 [8];
  long local_158 [8];
  C_Integer aCStack_118 [8];
  C_Integer aCStack_d8 [8];
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long lStack_78;
  Integer *in_stack_ffffffffffffff90;
  Integer *in_stack_ffffffffffffff98;
  Integer *in_stack_ffffffffffffffa0;
  Integer *in_stack_ffffffffffffffa8;
  Integer *in_stack_ffffffffffffffb0;
  Integer in_stack_ffffffffffffffb8;
  long local_40;
  long local_28;
  long local_20;
  long local_18;
  
  lVar4 = in_RDI + 1000;
  local_3e0 = pnga_nodeid();
  local_3f0 = (void *)0x0;
  local_3f8 = (long *)0x0;
  lVar5 = pnga_has_ghosts(in_RDI);
  if (lVar5 != 0) {
    local_80 = (long)GA[lVar4].elemsize;
    local_88 = (long)GA[lVar4].ndim;
    local_3e8 = (long)GA[lVar4].p_handle;
    for (local_18 = 0; local_18 < local_88; local_18 = local_18 + 1) {
      aCStack_d8[local_18] = GA[lVar4].width[local_18];
      aCStack_118[local_18] = GA[lVar4].dims[local_18];
    }
    lVar5 = gai_check_ghost_distr(in_RDI);
    if (lVar5 != 0) {
      local_3f0 = malloc((GAnproc * 0xe + 1) * 8);
      if (local_3f0 == (void *)0x0) {
        pnga_error(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
      }
      local_3f8 = (long *)malloc(GAnproc << 3);
      if (local_3f8 == (long *)0x0) {
        pnga_error(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
      }
      ga_init_nbhandle(in_stack_fffffffffffff7c0);
      local_3d0 = (Integer *)GA[lVar4].ptr[local_3e0];
      pnga_distribution(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                        in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      local_40 = 1;
      for (local_18 = 0; local_18 < local_88; local_18 = local_18 + 1) {
        local_40 = local_40 * 3;
      }
      for (local_20 = 0; local_20 < local_40; local_20 = local_20 + 1) {
        local_98 = local_20;
        local_360 = 1;
        for (local_18 = 0; local_18 < local_88; local_18 = local_18 + 1) {
          local_90 = local_98 % 3;
          (&lStack_78)[local_18] = local_90 + -1;
          if ((&lStack_78)[local_18] != 0) {
            local_360 = 0;
          }
          local_98 = (local_98 - local_90) / 3;
        }
        if (local_360 == 0) {
          local_360 = 0;
          local_98 = 0;
          for (local_18 = 0; local_18 < local_88; local_18 = local_18 + 1) {
            if (((&lStack_78)[local_18] != 0) && (aCStack_d8[local_18] == 0)) {
              local_360 = 1;
            }
            if ((&lStack_78)[local_18] != 0) {
              local_98 = local_98 + 1;
            }
          }
          if (local_360 == 0) {
            for (local_18 = 0; local_18 < local_88; local_18 = local_18 + 1) {
              if ((&lStack_78)[local_18] == 0) {
                local_258[local_18] = local_158[local_18];
                local_298[local_18] = local_198[local_18];
              }
              else if ((&lStack_78)[local_18] == -1) {
                if (local_158[local_18] < 2) {
                  local_258[local_18] = (aCStack_118[local_18] - aCStack_d8[local_18]) + 1;
                  local_298[local_18] = aCStack_118[local_18];
                }
                else {
                  local_258[local_18] = local_158[local_18] - aCStack_d8[local_18];
                  local_298[local_18] = local_158[local_18] + -1;
                }
              }
              else if ((&lStack_78)[local_18] == 1) {
                if (local_198[local_18] < aCStack_118[local_18]) {
                  local_258[local_18] = local_198[local_18] + 1;
                  local_298[local_18] = local_198[local_18] + aCStack_d8[local_18];
                }
                else {
                  local_258[local_18] = 1;
                  local_298[local_18] = aCStack_d8[local_18];
                }
              }
              else {
                fprintf(_stderr,"Illegal mask value found\n");
              }
            }
            lVar5 = pnga_locate_region(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                       in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                       in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
            if (lVar5 == 0) {
              local_408 = "cannot locate region: ";
              sprintf(local_508,"%s","cannot locate region: ");
              local_3fc = 0;
              sVar6 = strlen(local_408);
              local_400 = (int)sVar6;
              sprintf(local_508 + local_400,"%s",GA[in_RDI + 1000].name);
              sVar6 = strlen(local_508);
              local_400 = (int)sVar6;
              sprintf(local_508 + (int)sVar6," [%ld:%ld ",local_258[local_3fc],local_298[local_3fc])
              ;
              sVar6 = strlen(local_508);
              local_400 = (int)sVar6;
              local_3fc = 1;
              while( true ) {
                in_stack_fffffffffffff7e0 = (long)local_3fc;
                IVar7 = pnga_ndim(in_stack_fffffffffffff990);
                if (IVar7 <= in_stack_fffffffffffff7e0) break;
                sprintf(local_508 + local_400,",%ld:%ld ",local_258[local_3fc],local_298[local_3fc])
                ;
                sVar6 = strlen(local_508);
                local_400 = (int)sVar6;
                local_3fc = local_3fc + 1;
              }
              sprintf(local_508 + local_400,"%s","]");
              sVar6 = strlen(local_508);
              local_400 = (int)sVar6;
              pnga_error(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
            }
            if (1 < local_28) {
              fprintf(_stderr,"More than one remote processor found\n");
            }
            lVar3 = *local_3f8;
            pnga_distribution(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                              in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
            for (local_18 = 0; local_18 < local_88; local_18 = local_18 + 1) {
              if ((&lStack_78)[local_18] == 0) {
                aCStack_1d8[local_18] = aCStack_d8[local_18];
                alStack_218[local_18] =
                     (local_198[local_18] - local_158[local_18]) + aCStack_d8[local_18];
                alStack_2d8[local_18] = aCStack_1d8[local_18];
              }
              else if ((&lStack_78)[local_18] == -1) {
                aCStack_1d8[local_18] = 0;
                alStack_218[local_18] = aCStack_d8[local_18] + -1;
                alStack_2d8[local_18] = (local_298[local_18] - local_258[local_18]) + 1;
              }
              else if ((&lStack_78)[local_18] == 1) {
                aCStack_1d8[local_18] =
                     (local_198[local_18] - local_158[local_18]) + aCStack_d8[local_18] + 1;
                alStack_218[local_18] =
                     (local_198[local_18] - local_158[local_18]) + aCStack_d8[local_18] * 2;
                alStack_2d8[local_18] = aCStack_d8[local_18];
              }
            }
            local_518 = 1;
            lVar8 = (long)(GA[lVar4].ndim + -1);
            local_528 = 0;
            if (GA[lVar4].distr_type == 0) {
              if (GA[lVar4].num_rstrctd == 0) {
                local_5d0 = (long)GA[lVar4].ndim;
                local_5d8 = 0;
                local_5b8 = 1;
                for (local_5c0 = 0; local_5c0 < local_5d0; local_5c0 = local_5c0 + 1) {
                  local_5b8 = GA[lVar4].nblock[local_5c0] * local_5b8;
                }
                if ((local_5b8 + -1 < local_3e0) || (local_3e0 < 0)) {
                  for (local_5c0 = 0; local_5c0 < local_5d0; local_5c0 = local_5c0 + 1) {
                    local_568[local_5c0] = 0;
                    local_5a8[local_5c0] = -1;
                  }
                }
                else {
                  local_5c8 = local_3e0;
                  for (local_5c0 = 0; local_5c0 < local_5d0; local_5c0 = local_5c0 + 1) {
                    local_5b0 = local_5c8 % (long)GA[lVar4].nblock[local_5c0];
                    local_5c8 = local_5c8 / (long)GA[lVar4].nblock[local_5c0];
                    local_5e0 = local_5b0 + local_5d8;
                    local_5d8 = GA[lVar4].nblock[local_5c0] + local_5d8;
                    local_568[local_5c0] = GA[lVar4].mapc[local_5e0];
                    if (local_5b0 == GA[lVar4].nblock[local_5c0] + -1) {
                      local_5a8[local_5c0] = GA[lVar4].dims[local_5c0];
                    }
                    else {
                      local_5a8[local_5c0] = GA[lVar4].mapc[local_5e0 + 1] + -1;
                    }
                  }
                }
              }
              else if (local_3e0 < GA[lVar4].num_rstrctd) {
                local_608 = (long)GA[lVar4].ndim;
                local_610 = 0;
                local_5f0 = 1;
                for (local_5f8 = 0; local_5f8 < local_608; local_5f8 = local_5f8 + 1) {
                  local_5f0 = GA[lVar4].nblock[local_5f8] * local_5f0;
                }
                if ((local_5f0 + -1 < local_3e0) || (local_3e0 < 0)) {
                  for (local_5f8 = 0; local_5f8 < local_608; local_5f8 = local_5f8 + 1) {
                    local_568[local_5f8] = 0;
                    local_5a8[local_5f8] = -1;
                  }
                }
                else {
                  local_600 = local_3e0;
                  for (local_5f8 = 0; local_5f8 < local_608; local_5f8 = local_5f8 + 1) {
                    local_5e8 = local_600 % (long)GA[lVar4].nblock[local_5f8];
                    local_600 = local_600 / (long)GA[lVar4].nblock[local_5f8];
                    local_618 = local_5e8 + local_610;
                    local_610 = GA[lVar4].nblock[local_5f8] + local_610;
                    local_568[local_5f8] = GA[lVar4].mapc[local_618];
                    if (local_5e8 == GA[lVar4].nblock[local_5f8] + -1) {
                      local_5a8[local_5f8] = GA[lVar4].dims[local_5f8];
                    }
                    else {
                      local_5a8[local_5f8] = GA[lVar4].mapc[local_618 + 1] + -1;
                    }
                  }
                }
              }
              else {
                sVar1 = GA[lVar4].ndim;
                local_620 = (int)sVar1;
                for (local_61c = 0; local_61c < sVar1; local_61c = local_61c + 1) {
                  local_568[local_61c] = 0;
                  local_5a8[local_61c] = -1;
                }
              }
            }
            else {
              local_688 = (int)local_3e0;
              if (((GA[lVar4].distr_type == 1) || (GA[lVar4].distr_type == 2)) ||
                 (GA[lVar4].distr_type == 3)) {
                sVar1 = GA[lVar4].ndim;
                sVar2 = GA[lVar4].ndim;
                local_648[0] = (int)((long)local_688 % GA[lVar4].num_blocks[0]);
                local_654 = local_688;
                for (local_658 = 1; local_658 < sVar2; local_658 = local_658 + 1) {
                  local_654 = (int)((long)(local_654 - local_648[local_658 + -1]) /
                                   GA[lVar4].num_blocks[local_658 + -1]);
                  local_648[local_658] = (int)((long)local_654 % GA[lVar4].num_blocks[local_658]);
                }
                for (local_64c = 0; local_64c < sVar1; local_64c = local_64c + 1) {
                  local_568[local_64c] =
                       (long)local_648[local_64c] * GA[lVar4].block_dims[local_64c] + 1;
                  local_5a8[local_64c] =
                       (long)(local_648[local_64c] + 1) * GA[lVar4].block_dims[local_64c];
                  if (GA[lVar4].dims[local_64c] < local_5a8[local_64c]) {
                    local_5a8[local_64c] = GA[lVar4].dims[local_64c];
                  }
                }
              }
              else if (GA[lVar4].distr_type == 4) {
                sVar1 = GA[lVar4].ndim;
                local_684 = 0;
                sVar2 = GA[lVar4].ndim;
                local_678[0] = (int)((long)local_688 % GA[lVar4].num_blocks[0]);
                for (local_68c = 1; local_68c < sVar2; local_68c = local_68c + 1) {
                  local_688 = (int)((long)(local_688 - local_678[local_68c + -1]) /
                                   GA[lVar4].num_blocks[local_68c + -1]);
                  local_678[local_68c] = (int)((long)local_688 % GA[lVar4].num_blocks[local_68c]);
                }
                for (local_67c = 0; local_67c < sVar1; local_67c = local_67c + 1) {
                  local_568[local_67c] = GA[lVar4].mapc[local_684 + local_678[local_67c]];
                  if ((long)local_678[local_67c] < GA[lVar4].num_blocks[local_67c] + -1) {
                    local_5a8[local_67c] = GA[lVar4].mapc[local_684 + local_678[local_67c] + 1] + -1
                    ;
                  }
                  else {
                    local_5a8[local_67c] = GA[lVar4].dims[local_67c];
                  }
                  local_684 = local_684 + (int)GA[lVar4].num_blocks[local_67c];
                }
              }
            }
            if (lVar8 == 0) {
              local_318[0] = (local_5a8[0] - local_568[0]) + 1 + GA[lVar4].width[0] * 2;
            }
            for (local_510 = 0; local_510 < lVar8; local_510 = local_510 + 1) {
              local_528 = aCStack_1d8[local_510] * local_518 + local_528;
              local_318[local_510] =
                   (local_5a8[local_510] - local_568[local_510]) + 1 +
                   GA[lVar4].width[local_510] * 2;
              local_518 = local_318[local_510] * local_518;
            }
            local_3d0 = (Integer *)
                        (GA[lVar4].ptr[local_3e0] +
                        (aCStack_1d8[lVar8] * local_518 + local_528) * (long)GA[lVar4].elemsize);
            local_6a0 = 1;
            lVar8 = (long)(GA[lVar4].ndim + -1);
            local_6b0 = 0;
            if (GA[lVar4].distr_type == 0) {
              if (GA[lVar4].num_rstrctd == 0) {
                local_750 = (long)GA[lVar4].ndim;
                local_758 = 0;
                local_738 = 1;
                for (local_740 = 0; local_740 < local_750; local_740 = local_740 + 1) {
                  local_738 = GA[lVar4].nblock[local_740] * local_738;
                }
                if ((local_738 + -1 < lVar3) || (lVar3 < 0)) {
                  for (local_740 = 0; local_740 < local_750; local_740 = local_740 + 1) {
                    local_6e8[local_740] = 0;
                    local_728[local_740] = -1;
                  }
                }
                else {
                  local_748 = lVar3;
                  for (local_740 = 0; local_740 < local_750; local_740 = local_740 + 1) {
                    local_730 = local_748 % (long)GA[lVar4].nblock[local_740];
                    local_748 = local_748 / (long)GA[lVar4].nblock[local_740];
                    local_760 = local_730 + local_758;
                    local_758 = GA[lVar4].nblock[local_740] + local_758;
                    local_6e8[local_740] = GA[lVar4].mapc[local_760];
                    if (local_730 == GA[lVar4].nblock[local_740] + -1) {
                      local_728[local_740] = GA[lVar4].dims[local_740];
                    }
                    else {
                      local_728[local_740] = GA[lVar4].mapc[local_760 + 1] + -1;
                    }
                  }
                }
              }
              else if (lVar3 < GA[lVar4].num_rstrctd) {
                local_788 = (long)GA[lVar4].ndim;
                local_790 = 0;
                local_770 = 1;
                for (local_778 = 0; local_778 < local_788; local_778 = local_778 + 1) {
                  local_770 = GA[lVar4].nblock[local_778] * local_770;
                }
                if ((local_770 + -1 < lVar3) || (lVar3 < 0)) {
                  for (local_778 = 0; local_778 < local_788; local_778 = local_778 + 1) {
                    local_6e8[local_778] = 0;
                    local_728[local_778] = -1;
                  }
                }
                else {
                  local_780 = lVar3;
                  for (local_778 = 0; local_778 < local_788; local_778 = local_778 + 1) {
                    local_768 = local_780 % (long)GA[lVar4].nblock[local_778];
                    local_780 = local_780 / (long)GA[lVar4].nblock[local_778];
                    local_798 = local_768 + local_790;
                    local_790 = GA[lVar4].nblock[local_778] + local_790;
                    local_6e8[local_778] = GA[lVar4].mapc[local_798];
                    if (local_768 == GA[lVar4].nblock[local_778] + -1) {
                      local_728[local_778] = GA[lVar4].dims[local_778];
                    }
                    else {
                      local_728[local_778] = GA[lVar4].mapc[local_798 + 1] + -1;
                    }
                  }
                }
              }
              else {
                sVar1 = GA[lVar4].ndim;
                local_7a0 = (int)sVar1;
                for (local_79c = 0; local_79c < sVar1; local_79c = local_79c + 1) {
                  local_6e8[local_79c] = 0;
                  local_728[local_79c] = -1;
                }
              }
            }
            else {
              local_808 = (int)lVar3;
              if (((GA[lVar4].distr_type == 1) || (GA[lVar4].distr_type == 2)) ||
                 (GA[lVar4].distr_type == 3)) {
                sVar1 = GA[lVar4].ndim;
                local_7d0 = (int)sVar1;
                sVar2 = GA[lVar4].ndim;
                local_7dc = (int)sVar2;
                local_7d4 = local_808;
                local_7c8[0] = (int)((long)local_808 % GA[lVar4].num_blocks[0]);
                for (local_7d8 = 1; local_7d8 < sVar2; local_7d8 = local_7d8 + 1) {
                  local_7d4 = (int)((long)(local_7d4 - local_7c8[local_7d8 + -1]) /
                                   GA[lVar4].num_blocks[local_7d8 + -1]);
                  local_7c8[local_7d8] = (int)((long)local_7d4 % GA[lVar4].num_blocks[local_7d8]);
                }
                for (local_7cc = 0; local_7cc < sVar1; local_7cc = local_7cc + 1) {
                  local_6e8[local_7cc] =
                       (long)local_7c8[local_7cc] * GA[lVar4].block_dims[local_7cc] + 1;
                  local_728[local_7cc] =
                       (long)(local_7c8[local_7cc] + 1) * GA[lVar4].block_dims[local_7cc];
                  if (GA[lVar4].dims[local_7cc] < local_728[local_7cc]) {
                    local_728[local_7cc] = GA[lVar4].dims[local_7cc];
                  }
                }
              }
              else if (GA[lVar4].distr_type == 4) {
                sVar1 = GA[lVar4].ndim;
                local_804 = 0;
                sVar2 = GA[lVar4].ndim;
                local_7f8[0] = (int)((long)local_808 % GA[lVar4].num_blocks[0]);
                for (local_80c = 1; local_80c < sVar2; local_80c = local_80c + 1) {
                  local_808 = (int)((long)(local_808 - local_7f8[local_80c + -1]) /
                                   GA[lVar4].num_blocks[local_80c + -1]);
                  local_7f8[local_80c] = (int)((long)local_808 % GA[lVar4].num_blocks[local_80c]);
                }
                for (local_7fc = 0; local_7fc < sVar1; local_7fc = local_7fc + 1) {
                  local_6e8[local_7fc] = GA[lVar4].mapc[local_804 + local_7f8[local_7fc]];
                  if ((long)local_7f8[local_7fc] < GA[lVar4].num_blocks[local_7fc] + -1) {
                    local_728[local_7fc] = GA[lVar4].mapc[local_804 + local_7f8[local_7fc] + 1] + -1
                    ;
                  }
                  else {
                    local_728[local_7fc] = GA[lVar4].dims[local_7fc];
                  }
                  local_804 = local_804 + (int)GA[lVar4].num_blocks[local_7fc];
                }
              }
            }
            if (lVar8 == 0) {
              local_358[0] = (local_728[0] - local_6e8[0]) + 1 + GA[lVar4].width[0] * 2;
            }
            for (local_698 = 0; local_698 < lVar8; local_698 = local_698 + 1) {
              local_6b0 = alStack_2d8[local_698] * local_6a0 + local_6b0;
              local_358[local_698] =
                   (local_728[local_698] - local_6e8[local_698]) + 1 +
                   GA[lVar4].width[local_698] * 2;
              local_6a0 = local_358[local_698] * local_6a0;
            }
            local_3d8 = (int *)(GA[lVar4].ptr[lVar3] +
                               (alStack_2d8[lVar8] * local_6a0 + local_6b0) *
                               (long)GA[lVar4].elemsize);
            local_388[0] = (int)local_80;
            local_3a8[0] = (int)local_80;
            for (iVar10 = 0; (long)iVar10 < local_88 + -1; iVar10 = iVar10 + 1) {
              local_3a8[iVar10] = (int)local_358[iVar10] * local_3a8[iVar10];
              local_388[iVar10] = (int)local_318[iVar10] * local_388[iVar10];
              local_3a8[iVar10 + 1] = local_3a8[iVar10];
              local_388[iVar10 + 1] = local_388[iVar10];
            }
            for (iVar9 = 0; iVar9 < local_88; iVar9 = iVar9 + 1) {
              local_3c8[iVar9] = ((int)alStack_218[iVar9] - (int)aCStack_1d8[iVar9]) + 1;
            }
            local_3c8[0] = local_3c8[0] * (int)local_80;
            dst_stride_arr = local_3a8;
            src_stride_arr = local_388;
            src_ptr = local_3c8;
            count_00 = local_3d8;
            dst_ptr = local_3d0;
            get_armci_nbhandle(local_3d0);
            ARMCI_NbGetS(src_ptr,src_stride_arr,dst_ptr,dst_stride_arr,count_00,
                         in_stack_fffffffffffff7ac,(int)in_stack_fffffffffffff7e0,
                         (armci_hdl_t *)CONCAT44(iVar10,iVar9));
          }
        }
      }
      free(local_3f0);
      free(local_3f8);
    }
  }
  return;
}

Assistant:

void pnga_update_ghosts_nb(Integer g_a, Integer *nbhandle)
{
  Integer idx, ipx, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer ntot, mask[MAXDIM];
  Integer size, ndim, i, itmp;
  Integer width[MAXDIM], dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  /*Integer tlo_loc[MAXDIM], thi_loc[MAXDIM];*/
  Integer plo_loc[MAXDIM], phi_loc[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer plo_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  logical mask0;
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) {
    return;
  }

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  /* initialize ghost cell widths and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater than
     the corresponding value in width[]). */
  if (!gai_check_ghost_distr(g_a)) return;

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update_ghosts_nb:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update_ghosts_nb:malloc failed (_ga_proclist)",0);

  /* Create non-blocking handle */
  ga_init_nbhandle(nbhandle);

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* evaluate total number of PUT operations that will be required */
  ntot = 1;
  for (idx=0; idx < ndim; idx++) ntot *= 3;

  /* Loop over all GET operations. The operation corresponding to the
     mask of all zeros is left out. */
  for (ipx=0; ipx < ntot; ipx++) {
    /* Convert ipx to corresponding mask values */
    itmp = ipx;
    mask0 = TRUE;
    for (idx = 0; idx < ndim; idx++) {
      i = itmp%3;
      mask[idx] = i-1;
      if (mask[idx] != 0) mask0 = FALSE;
      itmp = (itmp-i)/3;
    }
    if (mask0) continue;

    /* check to see if ghost cell block has zero elements*/
    mask0 = FALSE;
    itmp = 0;
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] != 0 && width[idx] == 0) mask0 = TRUE;
      if (mask[idx] != 0) itmp++;
    }
    if (mask0) continue;
    /* Now that mask has been determined, find data that is to be moved
     * and identify processor to which it is going. Wrap boundaries
     * around, if necessary */
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        tlo_rem[idx] = lo_loc[idx];
        thi_rem[idx] = hi_loc[idx];
      } else if (mask[idx] == -1) {
        if (lo_loc[idx] > 1) {
          tlo_rem[idx] = lo_loc[idx]-width[idx];
          thi_rem[idx] = lo_loc[idx]-1;
        } else {
          tlo_rem[idx] = dims[idx]-width[idx]+1;
          thi_rem[idx] = dims[idx];
        }
      } else if (mask[idx] == 1) {
        if (hi_loc[idx] < dims[idx]) {
          tlo_rem[idx] = hi_loc[idx] + 1;
          thi_rem[idx] = hi_loc[idx] + width[idx];
        } else {
          tlo_rem[idx] = 1;
          thi_rem[idx] = width[idx];
        }
      } else {
        fprintf(stderr,"Illegal mask value found\n");
      }
    }
    /* Locate remote processor from which data must be retrieved */
    if (!pnga_locate_region(g_a, tlo_rem, thi_rem, _ga_map,
       _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
       tlo_rem, thi_rem, g_a);
    if (np > 1) {
      fprintf(stderr,"More than one remote processor found\n");
    }
    /* Remote processor has been identified, now get ready to get
       data from it. Start by getting distribution on remote
       processor.*/
    proc_rem = _ga_proclist[0];
    pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        plo_loc[idx] = width[idx];
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx];
        plo_rem[idx] = plo_loc[idx];
      } else if (mask[idx] == -1) {
        plo_loc[idx] = 0;
        phi_loc[idx] = width[idx]-1;
        plo_rem[idx] = thi_rem[idx]-tlo_rem[idx]+1;
      } else if (mask[idx] == 1) {
        plo_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx]+1;
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+2*width[idx];
        plo_rem[idx] = width[idx];
      }
    }
    /* Get pointer to local data buffer and remote data
       buffer as well as lists of leading dimenstions */
    gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
    gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

    /* Evaluate strides on local and remote processors */
    gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
                  stride_loc);

    /* Compute the number of elements in each dimension and store
       result in count. Scale the first element in count by the
       element size. */
    gam_ComputeCount(ndim, plo_loc, phi_loc, count);
    count[0] *= size;
 
    /* get data from remote processor */
    if (p_handle >= 0) {
      proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
    }
    ARMCI_NbGetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
        (int)(ndim - 1), (int)proc_rem, 
        (armci_hdl_t*)get_armci_nbhandle(nbhandle));
  }

  free(_ga_map);
  free(_ga_proclist);
  return;
}